

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst(QGenericArrayOps<QByteArray> *this)

{
  QByteArray **ppQVar1;
  qsizetype *pqVar2;
  QByteArray *pQVar3;
  Data *pDVar4;
  
  pQVar3 = (this->super_QArrayDataPointer<QByteArray>).ptr;
  pDVar4 = (pQVar3->d).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((pQVar3->d).d)->super_QArrayData,1,0x10);
    }
  }
  ppQVar1 = &(this->super_QArrayDataPointer<QByteArray>).ptr;
  *ppQVar1 = *ppQVar1 + 1;
  pqVar2 = &(this->super_QArrayDataPointer<QByteArray>).size;
  *pqVar2 = *pqVar2 + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }